

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

TableViewSection * __thiscall QtMWidgets::TableView::removeSection(TableView *this,int index)

{
  AbstractScrollAreaPrivate *pAVar1;
  TableViewSection *pTVar2;
  ulong i;
  
  if (-1 < index) {
    pAVar1 = (this->super_ScrollArea).super_AbstractScrollArea.d.d;
    i = (ulong)(uint)index;
    if ((long)i < (long)pAVar1[1].topLeftCorner) {
      pTVar2 = *(TableViewSection **)((long)pAVar1[1].scrolledAreaSize + i * 8);
      QLayout::removeWidget(*(QWidget **)((long)&pAVar1[1].indicatorColor.ct + 4));
      QWidget::setParent(&pTVar2->super_QWidget);
      QWidget::hide();
      QList<QtMWidgets::TableViewSection_*>::removeAt
                ((QList<QtMWidgets::TableViewSection_*> *)&pAVar1[1].viewport,i);
      QWidget::adjustSize();
      return pTVar2;
    }
  }
  return (TableViewSection *)0x0;
}

Assistant:

TableViewSection *
TableView::removeSection( int index )
{
	TableViewPrivate * d = d_func();

	if( index >= 0 && index < d->sections.size() )
	{
		TableViewSection * s = d->sections.at( index );

		d->layout->removeWidget( s );
		s->setParent( 0 );
		s->hide();

		d->sections.removeAt( index );

		d->widget->adjustSize();

		return s;
	}
	else
		return 0;
}